

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

yyjson_mut_val *
duckdb_yyjson::unsafe_yyjson_mut_ptr_removex
          (yyjson_mut_val *val,char *ptr,size_t len,yyjson_ptr_ctx *ctx,yyjson_ptr_err *err)

{
  yyjson_mut_val *pyVar1;
  yyjson_mut_val *pyVar2;
  ulong *puVar3;
  undefined8 uVar4;
  yyjson_mut_val *pyVar5;
  int iVar6;
  yyjson_mut_val *pyVar7;
  yyjson_ptr_ctx *pyVar8;
  long lVar9;
  ulong __n;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  yyjson_mut_val *cur;
  yyjson_mut_val *prev;
  ulong *puVar13;
  yyjson_ptr_ctx cur_ctx;
  ulong local_70;
  yyjson_ptr_ctx local_48;
  
  local_48.ctn = (yyjson_mut_val *)0x0;
  local_48.pre = (yyjson_mut_val *)0x0;
  local_48.old = (yyjson_mut_val *)0x0;
  pyVar8 = ctx;
  if (ctx == (yyjson_ptr_ctx *)0x0) {
    pyVar8 = &local_48;
  }
  pyVar7 = unsafe_yyjson_mut_ptr_getx(val,ptr,len,pyVar8,err);
  if (pyVar7 != (yyjson_mut_val *)0x0) {
    pyVar1 = pyVar8->ctn;
    if (pyVar1 != (yyjson_mut_val *)0x0) {
      local_70 = pyVar1->tag;
      pyVar8 = ctx;
      if (ctx == (yyjson_ptr_ctx *)0x0) {
        pyVar8 = &local_48;
      }
      pyVar2 = pyVar8->pre;
      if ((~(uint)local_70 & 7) == 0) {
        pyVar2 = pyVar2->next->next;
        if ((pyVar2 != (yyjson_mut_val *)0x0) && (((uint)pyVar2->tag & 7) == 5)) {
          uVar11 = 0;
          puVar13 = (ulong *)0x0;
          if (0xff < local_70) {
            uVar11 = local_70 >> 8;
            puVar13 = (ulong *)(pyVar1->uni).u64;
          }
          __n = pyVar2->tag >> 8;
          uVar10 = 0;
          while (uVar10 < uVar11) {
            uVar12 = puVar13[2];
            puVar3 = *(ulong **)(uVar12 + 0x10);
            if (puVar3 == (ulong *)0x0) break;
            if (*puVar3 >> 8 == __n) {
              iVar6 = bcmp((void *)puVar3[1],(pyVar2->uni).ptr,__n);
              if (iVar6 != 0) goto LAB_01f31716;
              uVar4 = *(undefined8 *)(puVar3[2] + 0x10);
              uVar11 = uVar11 - 1;
              if (uVar11 == uVar10) {
                (pyVar1->uni).u64 = (uint64_t)puVar13;
                uVar12 = puVar13[2];
              }
              local_70 = uVar11 * 0x100 | local_70 & 0xff;
              pyVar1->tag = local_70;
              *(undefined8 *)(uVar12 + 0x10) = uVar4;
            }
            else {
LAB_01f31716:
              uVar10 = uVar10 + 1;
              puVar13 = puVar3;
            }
          }
        }
      }
      else if (pyVar2 != (yyjson_mut_val *)0x0) {
        pyVar5 = pyVar2->next;
        pyVar2->next = pyVar5->next;
        if ((yyjson_mut_val *)(pyVar1->uni).u64 == pyVar5) {
          (pyVar1->uni).u64 = (uint64_t)pyVar2;
        }
        lVar9 = (local_70 >> 8) - 1;
        if (lVar9 == 0) {
          (pyVar1->uni).u64 = 0;
        }
        pyVar1->tag = lVar9 * 0x100 | local_70 & 0xff;
      }
    }
    pyVar8 = &local_48;
    if (ctx != (yyjson_ptr_ctx *)0x0) {
      pyVar8 = ctx;
    }
    pyVar8->pre = (yyjson_mut_val *)0x0;
    pyVar8->old = pyVar7;
  }
  return pyVar7;
}

Assistant:

yyjson_mut_val *unsafe_yyjson_mut_ptr_removex(yyjson_mut_val *val,
                                              const char *ptr,
                                              size_t len,
                                              yyjson_ptr_ctx *ctx,
                                              yyjson_ptr_err *err) {
    yyjson_mut_val *cur_val;
    yyjson_ptr_ctx cur_ctx;
    memset(&cur_ctx, 0, sizeof(cur_ctx));
    if (!ctx) ctx = &cur_ctx;
    cur_val = unsafe_yyjson_mut_ptr_getx(val, ptr, len, ctx, err);
    if (cur_val) {
        if (yyjson_mut_is_obj(ctx->ctn)) {
            yyjson_mut_val *key = ctx->pre->next->next;
            yyjson_mut_obj_put(ctx->ctn, key, NULL);
        } else {
            yyjson_ptr_ctx_remove(ctx);
        }
        ctx->pre = NULL;
        ctx->old = cur_val;
    }
    return cur_val;
}